

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QStyleSheetPositionData>::reset
          (QSharedDataPointer<QStyleSheetPositionData> *this,QStyleSheetPositionData *ptr)

{
  QStyleSheetPositionData *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != ptr) {
    if (ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar1 != (QStyleSheetPositionData *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pQVar1,0x24);
        return;
      }
    }
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }